

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O2

double * __thiscall trento::random::CyclicNormal<double>::operator()(CyclicNormal<double> *this)

{
  double *pdVar1;
  ulong uVar2;
  
  uVar2 = this->loop_count;
  if (this->n_loops_ < uVar2) {
    std::
    shuffle<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>&>
              ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
               (this->cache_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start,
               (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
               (this->cache_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish,
               (mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                *)engine);
    this->loop_count = 0;
    uVar2 = 0;
  }
  pdVar1 = (this->iter_)._M_current;
  if (pdVar1 == (this->cache_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish) {
    pdVar1 = (this->cache_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    this->loop_count = uVar2 + 1;
  }
  (this->iter_)._M_current = pdVar1 + 1;
  return pdVar1;
}

Assistant:

const RealType& operator()() {
    if (loop_count > n_loops_) {
      std::shuffle(cache_.begin(), cache_.end(), random::engine); 
      loop_count = 0;
    }
    if (iter_ == cache_.end()) {
      iter_ = cache_.begin();
      ++loop_count;
    }

    return *iter_++;
  }